

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCut.c
# Opt level: O3

void Bmc_GiaGenerateJustNonRec(Gia_Man_t *p,int iFrame,Vec_Bit_t *vValues,Vec_Bit_t *vJustis)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  int *piVar6;
  int *piVar7;
  bool bVar8;
  Gia_Obj_t *pGVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  int local_5c;
  
  if (-1 < iFrame) {
    uVar18 = p->nObjs;
    local_5c = uVar18 * iFrame;
    do {
      if (0 < (int)uVar18) {
        uVar14 = (ulong)(uint)p->nObjs;
        if (p->nObjs < (int)uVar18) {
LAB_0057c91e:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar19 = (ulong)uVar18;
        pGVar5 = p->pObjs;
        uVar11 = local_5c - 1;
        pGVar9 = pGVar5 + uVar19;
        while( true ) {
          uVar18 = (uint)uVar14;
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          if (uVar19 == 1) {
            uVar18 = p->nObjs;
            break;
          }
          uVar14 = *(ulong *)(pGVar9 + -1);
          uVar17 = (uint)uVar14;
          uVar15 = (uint)(uVar14 >> 0x20);
          if (((uVar17 & 0x9fffffff) != 0x9fffffff) ||
             (p->vCis->nSize - p->nRegs <= (int)(uVar15 & 0x1fffffff))) {
            uVar16 = (long)local_5c + -1 + uVar19;
            if (((long)uVar16 < 0) || (uVar2 = vJustis->nSize, (long)(int)uVar2 <= (long)uVar16))
            goto LAB_0057c8ff;
            piVar6 = vJustis->pArray;
            uVar12 = uVar11 + (int)uVar19;
            if (((uint)piVar6[uVar16 >> 5] >> (uVar12 & 0x1f) & 1) != 0) {
              if ((uVar14 & 0x1fffffff) == 0x1fffffff || (int)uVar17 < 0) {
                if ((int)uVar17 < 0 && (int)(uVar14 & 0x1fffffff) != 0x1fffffff) {
                  uVar18 = (uVar11 + (int)uVar19) - (uVar17 & 0x1fffffff);
                  if (((int)uVar18 < 0) || (uVar2 <= uVar18)) goto LAB_0057c93d;
                  bVar10 = (byte)uVar18 & 0x1f;
                  uVar16 = (ulong)(uVar18 >> 5);
                }
                else {
                  if ((iFrame == 0) || ((uVar17 & 0x9fffffff) != 0x9fffffff)) goto LAB_0057c8ba;
                  iVar3 = p->vCis->nSize;
                  if ((int)(uVar15 & 0x1fffffff) < iVar3 - p->nRegs) {
                    __assert_fail("Gia_ObjIsRo(p, pObj)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                  ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
                  }
                  iVar4 = p->vCos->nSize;
                  uVar15 = (iVar4 - iVar3) + (uVar15 & 0x1fffffff);
                  if (((int)uVar15 < 0) || (iVar4 <= (int)uVar15)) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                  }
                  uVar15 = p->vCos->pArray[uVar15];
                  if (((int)uVar15 < 0) || (uVar18 <= uVar15)) goto LAB_0057c91e;
                  uVar15 = uVar15 + (local_5c - uVar18);
                  if (((int)uVar15 < 0) || (uVar2 <= uVar15)) goto LAB_0057c93d;
                  bVar10 = (byte)uVar15 & 0x1f;
                  uVar16 = (ulong)(uVar15 >> 5);
                }
              }
              else {
                uVar18 = vValues->nSize;
                if ((long)(int)uVar18 <= (long)uVar16) {
LAB_0057c8ff:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                                ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
                }
                piVar7 = vValues->pArray;
                lVar1 = uVar11 + uVar19;
                uVar13 = (ulong)-(uVar17 & 0x1fffffff) + lVar1;
                uVar17 = (uint)uVar13;
                if ((piVar7[uVar16 >> 5] & 1 << ((byte)uVar12 & 0x1f)) == 0) {
                  if (((int)uVar17 < 0) || (uVar18 <= uVar17)) goto LAB_0057c8ff;
                  uVar16 = uVar13 >> 5 & 0x7ffffff;
                  bVar10 = (byte)uVar13 & 0x1f;
                  if ((((uint)(uVar14 >> 0x1d) & 7 ^ (uint)piVar7[uVar16] >> bVar10) & 1) != 0) {
                    uVar14 = lVar1 + (ulong)-(uVar15 & 0x1fffffff);
                    uVar17 = (uint)uVar14;
                    if (((int)uVar17 < 0) || (uVar18 <= uVar17)) goto LAB_0057c8ff;
                    uVar16 = uVar14 >> 5 & 0x7ffffff;
                    bVar10 = (byte)uVar14 & 0x1f;
                    if (((uVar15 >> 0x1d ^ (uint)piVar7[uVar16] >> bVar10) & 1) != 0) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                                    ,0x61,
                                    "void Bmc_GiaGenerateJustNonRec(Gia_Man_t *, int, Vec_Bit_t *, Vec_Bit_t *)"
                                   );
                    }
                  }
                  if (uVar2 <= uVar17) goto LAB_0057c93d;
                }
                else {
                  if (((int)uVar17 < 0) || (uVar2 <= uVar17)) {
LAB_0057c93d:
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                                  ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
                  }
                  piVar6[uVar17 >> 5] = piVar6[uVar17 >> 5] | 1 << ((byte)uVar13 & 0x1f);
                  uVar18 = (int)lVar1 - (*(uint *)&pGVar9[-1].field_0x4 & 0x1fffffff);
                  if (((int)uVar18 < 0) || (vJustis->nSize <= (int)uVar18)) goto LAB_0057c93d;
                  bVar10 = (byte)uVar18 & 0x1f;
                  uVar16 = (ulong)(uVar18 >> 5);
                }
              }
              piVar6[uVar16] = piVar6[uVar16] | 1 << bVar10;
            }
          }
LAB_0057c8ba:
          uVar19 = uVar19 - 1;
          uVar14 = (ulong)p->nObjs;
          pGVar9 = pGVar9 + -1;
          if ((long)uVar14 < (long)uVar19) goto LAB_0057c91e;
        }
      }
      local_5c = local_5c - uVar18;
      bVar8 = 0 < iFrame;
      iFrame = iFrame + -1;
    } while (bVar8);
  }
  return;
}

Assistant:

void Bmc_GiaGenerateJustNonRec( Gia_Man_t * p, int iFrame, Vec_Bit_t * vValues, Vec_Bit_t * vJustis )
{
    Gia_Obj_t * pObj;
    int i, k, Shift = Gia_ManObjNum(p) * iFrame;
    for ( i = iFrame; i >= 0; i--, Shift -= Gia_ManObjNum(p) )
    {
        Gia_ManForEachObjReverse( p, pObj, k )
        {
            if ( k == 0 || Gia_ObjIsPi(p, pObj) )
                continue;
            if ( !Vec_BitEntry( vJustis, Shift + k ) )
                continue;
            if ( Gia_ObjIsAnd(pObj) )
            {
                if ( Vec_BitEntry( vValues, Shift + k ) )
                {
                    Vec_BitWriteEntry( vJustis, Shift + Gia_ObjFaninId0(pObj, k), 1 );
                    Vec_BitWriteEntry( vJustis, Shift + Gia_ObjFaninId1(pObj, k), 1 );
                }
                else if ( Vec_BitEntry( vValues, Shift + Gia_ObjFaninId0(pObj, k) ) == Gia_ObjFaninC0(pObj) )
                    Vec_BitWriteEntry( vJustis, Shift + Gia_ObjFaninId0(pObj, k), 1 );
                else if ( Vec_BitEntry( vValues, Shift + Gia_ObjFaninId1(pObj, k) ) == Gia_ObjFaninC1(pObj) )
                    Vec_BitWriteEntry( vJustis, Shift + Gia_ObjFaninId1(pObj, k), 1 );
                else assert( 0 );
            }
            else if ( Gia_ObjIsCo(pObj) )
                Vec_BitWriteEntry( vJustis, Shift + Gia_ObjFaninId0(pObj, k), 1 );
            else if ( Gia_ObjIsCi(pObj) && i )
                Vec_BitWriteEntry( vJustis, Shift - Gia_ManObjNum(p) + Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)), 1 );
        }
    }
}